

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O1

Vec_Ptr_t * Aig_ManRegPartitionSimple(Aig_Man_t *pAig,int nPartSize,int nOverSize)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Vec_Int_t *p;
  int *piVar6;
  int iVar7;
  int Entry;
  
  if (nPartSize <= nOverSize) {
    printf("Overlap size (%d) is more or equal than the partition size (%d).\n",
           (ulong)(uint)nOverSize,nPartSize);
    puts("Adjusting it to be equal to half of the partition size.");
    nOverSize = nPartSize / 2;
  }
  if (nPartSize <= nOverSize) {
    __assert_fail("nOverSize < nPartSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPartReg.c"
                  ,0x1e5,"Vec_Ptr_t *Aig_ManRegPartitionSimple(Aig_Man_t *, int, int)");
  }
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  if (0 < pAig->nRegs) {
    iVar3 = 0x10;
    if (0xe < nPartSize - 1U) {
      iVar3 = nPartSize;
    }
    Entry = 0;
    do {
      p = (Vec_Int_t *)malloc(0x10);
      p->nSize = 0;
      p->nCap = iVar3;
      if (iVar3 == 0) {
        piVar6 = (int *)0x0;
      }
      else {
        piVar6 = (int *)malloc((long)iVar3 << 2);
      }
      p->pArray = piVar6;
      iVar7 = nPartSize;
      if (0 < nPartSize) {
        do {
          if (Entry < pAig->nRegs) {
            Vec_IntPush(p,Entry);
          }
          Entry = Entry + 1;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      if (nOverSize < p->nSize) {
        uVar1 = pVVar4->nSize;
        uVar2 = pVVar4->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
            }
            iVar7 = 0x10;
          }
          else {
            iVar7 = uVar2 * 2;
            if (iVar7 <= (int)uVar2) goto LAB_00609b39;
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = iVar7;
        }
LAB_00609b39:
        pVVar4->nSize = uVar1 + 1;
        pVVar4->pArray[(int)uVar1] = p;
      }
      else {
        if (p->pArray != (int *)0x0) {
          free(p->pArray);
          p->pArray = (int *)0x0;
        }
        free(p);
      }
      Entry = Entry - nOverSize;
    } while (Entry < pAig->nRegs);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Aig_ManRegPartitionSimple( Aig_Man_t * pAig, int nPartSize, int nOverSize )
{
    Vec_Ptr_t * vResult;
    Vec_Int_t * vPart;
    int i, Counter;
    if ( nOverSize >= nPartSize )
    {
        printf( "Overlap size (%d) is more or equal than the partition size (%d).\n", nOverSize, nPartSize );
        printf( "Adjusting it to be equal to half of the partition size.\n" );
        nOverSize = nPartSize/2;
    }
    assert( nOverSize < nPartSize );
    vResult = Vec_PtrAlloc( 100 );
    for ( Counter = 0; Counter < Aig_ManRegNum(pAig); Counter -= nOverSize )
    {
        vPart = Vec_IntAlloc( nPartSize );
        for ( i = 0; i < nPartSize; i++, Counter++ )
            if ( Counter < Aig_ManRegNum(pAig) )
                Vec_IntPush( vPart, Counter );
        if ( Vec_IntSize(vPart) <= nOverSize )
            Vec_IntFree(vPart);
        else
            Vec_PtrPush( vResult, vPart );
    }
    return vResult;
}